

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int read_double_partial_array(coda_cursor *cursor,long offset,long length,double *dst)

{
  coda_backend cVar1;
  coda_type *local_40;
  coda_type_array *type;
  double *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_40 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_40 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if ((*(coda_type **)(local_40 + 1))->type_class == coda_special_class) {
    cursor_local._4_4_ = read_partial_array(cursor,read_double,offset,length,(uint8_t *)dst,8);
  }
  else {
    cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
    if (cVar1 == coda_backend_ascii) {
      cursor_local._4_4_ = coda_ascii_cursor_read_double_partial_array(cursor,offset,length,dst);
    }
    else if (cVar1 == coda_backend_binary) {
      cursor_local._4_4_ = coda_bin_cursor_read_double_partial_array(cursor,offset,length,dst);
    }
    else if (cVar1 == coda_backend_memory) {
      cursor_local._4_4_ = coda_mem_cursor_read_double_partial_array(cursor,offset,length,dst);
    }
    else if (cVar1 == coda_backend_hdf4) {
      coda_set_error(-0xb,(char *)0x0);
      cursor_local._4_4_ = -1;
    }
    else if (cVar1 == coda_backend_hdf5) {
      coda_set_error(-0xd,(char *)0x0);
      cursor_local._4_4_ = -1;
    }
    else if (cVar1 == coda_backend_cdf) {
      cursor_local._4_4_ = coda_cdf_cursor_read_double_partial_array(cursor,offset,length,dst);
    }
    else {
      if (cVar1 != coda_backend_netcdf) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                      ,0x6b6,
                      "int read_double_partial_array(const coda_cursor *, long, long, double *)");
      }
      cursor_local._4_4_ = coda_netcdf_cursor_read_double_partial_array(cursor,offset,length,dst);
    }
  }
  return cursor_local._4_4_;
}

Assistant:

static int read_double_partial_array(const coda_cursor *cursor, long offset, long length, double *dst)
{
    coda_type_array *type;

    type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->base_type->type_class == coda_special_class)
    {
        /* arrays of special types should be explicitly iterated */
        return read_partial_array(cursor, (read_function)&read_double, offset, length, (uint8_t *)dst, sizeof(double));
    }
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_double_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_double_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_grib:
            break;
    }

    assert(0);
    exit(1);
}